

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ClassExp(SQCompiler *this)

{
  SQObjectType SVar1;
  SQObjectValue arg0;
  SQFuncState *in_RDI;
  SQObject SVar2;
  SQInteger attrs;
  SQInteger base;
  SQInteger in_stack_00000060;
  SQCompiler *in_stack_00000068;
  SQCompiler *in_stack_00000080;
  SQInteger in_stack_000000f0;
  SQInteger in_stack_000000f8;
  SQCompiler *in_stack_00000100;
  SQCompiler *in_stack_ffffffffffffffc0;
  SQFuncState *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SQInteger in_stack_ffffffffffffffe0;
  SQInteger SVar3;
  SQOpcode SVar4;
  SQFuncState *this_00;
  
  this_00 = (SQFuncState *)0xffffffffffffffff;
  SVar3 = -1;
  if (in_RDI->_returnexp == 0x134) {
    Lex(in_stack_ffffffffffffffc0);
    Expression(in_stack_00000080);
    this_00 = (SQFuncState *)SQFuncState::TopTarget((SQFuncState *)0x1265a0);
  }
  if (in_RDI->_returnexp == 0x140) {
    Lex(in_stack_ffffffffffffffc0);
    SVar4 = (SQOpcode)((ulong)SVar3 >> 0x20);
    in_stack_ffffffffffffffc8 = (SQFuncState *)(in_RDI->_vlocals)._vals;
    SQFuncState::PushTarget(in_stack_ffffffffffffffc8,(SQInteger)in_stack_ffffffffffffffc0);
    SQFuncState::AddInstruction
              (this_00,SVar4,in_stack_ffffffffffffffe0,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(SQInteger)in_RDI,
               (SQInteger)in_stack_ffffffffffffffc8);
    ParseTableOrClass(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
    SVar3 = SQFuncState::TopTarget((SQFuncState *)0x12661a);
  }
  SVar2 = Expect(in_stack_00000068,in_stack_00000060);
  arg0 = SVar2._unVal;
  SVar1 = SVar2._type;
  if (SVar3 != -1) {
    SQFuncState::PopTarget(in_RDI);
  }
  SVar4 = (SQOpcode)((ulong)SVar3 >> 0x20);
  if (this_00 != (SQFuncState *)0xffffffffffffffff) {
    SQFuncState::PopTarget(in_RDI);
  }
  SQFuncState::PushTarget(in_stack_ffffffffffffffc8,(SQInteger)(in_RDI->_vlocals)._vals);
  SQFuncState::AddInstruction
            (this_00,SVar4,arg0.nInteger,CONCAT44(in_stack_ffffffffffffffdc,SVar1),(SQInteger)in_RDI
             ,(SQInteger)in_stack_ffffffffffffffc8);
  ParseTableOrClass(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  return;
}

Assistant:

void ClassExp()
    {
        SQInteger base = -1;
        SQInteger attrs = -1;
        if(_token == TK_EXTENDS) {
            Lex(); Expression();
            base = _fs->TopTarget();
        }
        if(_token == TK_ATTR_OPEN) {
            Lex();
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            ParseTableOrClass(_SC(','),TK_ATTR_CLOSE);
            attrs = _fs->TopTarget();
        }
        Expect(_SC('{'));
        if(attrs != -1) _fs->PopTarget();
        if(base != -1) _fs->PopTarget();
        _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), base, attrs,NOT_CLASS);
        ParseTableOrClass(_SC(';'),_SC('}'));
    }